

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O1

int __thiscall hwnet::Epoll::RunOnce(Epoll *this)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  epoll_event *peVar5;
  long lVar6;
  
  do {
    uVar2 = epoll_wait(this->epfd,(epoll_event *)this->events,this->maxevents,-1);
    if (uVar2 != 0xffffffff) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  iVar3 = -1;
  if (0 < (int)uVar2) {
    lVar6 = 0;
    do {
      puVar1 = *(undefined8 **)((long)&this->events->data + lVar6);
      (**(code **)*puVar1)(puVar1,*(undefined4 *)((long)&this->events->events + lVar6));
      lVar6 = lVar6 + 0xc;
    } while ((ulong)uVar2 * 0xc != lVar6);
    if (uVar2 == this->maxevents) {
      iVar3 = this->maxevents << 2;
      this->maxevents = iVar3;
      peVar5 = (epoll_event *)realloc(this->events,(long)iVar3 * 0xc);
      if (peVar5 == (epoll_event *)0x0) {
        return -1;
      }
      this->events = peVar5;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Epoll::RunOnce() {
	epoll_event *tmp;
	auto nfds = TEMP_FAILURE_RETRY(epoll_wait(this->epfd,this->events,this->maxevents,-1));
	if(nfds > 0) {
		for(auto i=0; i < nfds ; ++i) {
			epoll_event *event = &events[i];
			((Channel*)event->data.ptr)->OnActive(event->events);
		}	
		if(nfds == this->maxevents){
			this->maxevents <<= 2;
			tmp = (epoll_event*)realloc(this->events,sizeof(*this->events)*this->maxevents);
			if(nullptr == tmp) {
				//log error
				return -1;
			}
			this->events = tmp;
		}
		return 0;			
	} else {
		//log error
		return -1;
	}
}